

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<Fad<float>_>::~TPZVec(TPZVec<Fad<float>_> *this)

{
  long lVar1;
  long lVar2;
  Fad<float> *this_00;
  long lVar3;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TPZVec_023dfea0;
  if ((in_RDI[1] != 0) && (lVar1 = in_RDI[1], lVar1 != 0)) {
    this_00 = (Fad<float> *)(lVar1 + -8);
    lVar2 = *(long *)(lVar1 + -8);
    for (lVar3 = lVar1 + lVar2 * 0x20; lVar1 != lVar3; lVar3 = lVar3 + -0x20) {
      Fad<float>::~Fad(this_00);
    }
    operator_delete__(this_00,lVar2 * 0x20 + 8);
  }
  return;
}

Assistant:

inline TPZVec<T>::~TPZVec() {
	if( fStore )
	{
		delete [] fStore;
	}
}